

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

uhugeint_t __thiscall duckdb::Value::GetValueInternal<duckdb::uhugeint_t>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  char input;
  byte input_00;
  uint16_t input_01;
  short input_02;
  uint uVar3;
  uint64_t uVar4;
  char *__s;
  uhugeint_t uVar5;
  TryCast *this_00;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  InvalidInputException *pIVar9;
  string *psVar10;
  size_t sVar11;
  NotImplementedException *pNVar12;
  InternalException *pIVar13;
  int64_t iVar14;
  uint64_t uVar15;
  undefined8 uVar16;
  char input_03;
  bool input_04;
  uchar input_05;
  duckdb *pdVar17;
  undefined1 in_R8B;
  undefined1 auVar18 [12];
  uhugeint_t uVar19;
  undefined1 auVar20 [16];
  hugeint_t input_06;
  string_t input_07;
  string_t input_08;
  unkbyte10 Var21;
  uhugeint_t result;
  LogicalType local_b0;
  Value local_98;
  double local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  
  if (this->is_null == true) {
    pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Calling GetValueInternal on a value that is NULL","");
    InternalException::InternalException(pIVar13,(string *)&local_98);
    __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    bVar7 = (this->value_).boolean;
    bVar8 = TryCast::Operation<bool,duckdb::uhugeint_t>(bVar7,(uhugeint_t *)&local_b0,false);
    if (!bVar8) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<bool,duckdb::uhugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)bVar7,input_04);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case TINYINT:
    input = (this->value_).tinyint;
    bVar7 = TryCast::Operation<signed_char,duckdb::uhugeint_t>(input,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,duckdb::uhugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)(uint)(int)input,input_03);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case SMALLINT:
    input_02 = (this->value_).smallint;
    bVar7 = TryCast::Operation<short,duckdb::uhugeint_t>(input_02,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      Var21 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,duckdb::uhugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)(uint)(int)input_02,
                 (short)((unkuint10)Var21 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var21,(string *)&local_98);
      __cxa_throw((InvalidInputException *)Var21,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case INTEGER:
    uVar3 = (this->value_).integer;
    bVar7 = TryCast::Operation<int,duckdb::uhugeint_t>(uVar3,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      auVar18 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,duckdb::uhugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)uVar3,auVar18._8_4_);
      InvalidInputException::InvalidInputException(auVar18._0_8_,(string *)&local_98);
      __cxa_throw(auVar18._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case BIGINT:
    pdVar17 = (duckdb *)(this->value_).bigint;
    bVar7 = TryCast::Operation<long,duckdb::uhugeint_t>
                      ((int64_t)pdVar17,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      auVar20 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,duckdb::uhugeint_t>((string *)&local_98,pdVar17,auVar20._8_8_);
      InvalidInputException::InvalidInputException(auVar20._0_8_,(string *)&local_98);
      __cxa_throw(auVar20._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case DATE:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT32,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_SEC:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_MS:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_NS:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    LogicalType::LogicalType(&local_b0,DOUBLE);
    DefaultCastAs(&local_98,this,&local_b0,false);
    uVar19 = GetValueInternal<duckdb::uhugeint_t>(&local_98);
    ~Value(&local_98);
    LogicalType::~LogicalType(&local_b0);
    auVar20._0_8_ = uVar19.lower;
    auVar20._8_8_ = uVar19.upper;
    return (uhugeint_t)auVar20;
  case FLOAT:
    local_58 = (double)CONCAT44(local_58._4_4_,(this->value_).float_);
    pdVar17 = (duckdb *)0x0;
    bVar7 = TryCast::Operation<float,duckdb::uhugeint_t>
                      ((this->value_).float_,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,duckdb::uhugeint_t>((string *)&local_98,pdVar17,local_58._0_4_);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case DOUBLE:
    local_58 = (this->value_).double_;
    pdVar17 = (duckdb *)0x0;
    bVar7 = TryCast::Operation<double,duckdb::uhugeint_t>(local_58,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,duckdb::uhugeint_t>((string *)&local_98,pdVar17,local_58);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case VARCHAR:
    psVar10 = StringValue::Get_abi_cxx11_(this);
    __s = (psVar10->_M_dataplus)._M_p;
    sVar11 = strlen(__s);
    local_50 = (uint)sVar11;
    if (local_50 < 0xd) {
      uStack_44 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      if (local_50 != 0) {
        switchD_00b1422a::default(&uStack_4c,__s,(ulong)(local_50 & 0xf));
      }
    }
    else {
      uStack_4c = *(undefined4 *)__s;
      uStack_48 = SUB84(__s,0);
      uStack_44 = (undefined4)((ulong)__s >> 0x20);
    }
    this_00 = (TryCast *)CONCAT44(uStack_4c,local_50);
    uVar6 = CONCAT44(uStack_44,uStack_48);
    uVar16 = 0;
    input_08.value.pointer.ptr = (char *)&local_b0;
    input_08.value._0_8_ = uVar6;
    bVar7 = TryCast::Operation<duckdb::string_t,duckdb::uhugeint_t>
                      (this_00,input_08,(uhugeint_t *)0x0,(bool)in_R8B);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_07.value.pointer.ptr = (char *)uVar16;
      input_07.value._0_8_ = uVar6;
      CastExceptionText<duckdb::string_t,duckdb::uhugeint_t>
                ((string *)&local_98,(duckdb *)this_00,input_07);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case INTERVAL:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INTERVAL,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UTINYINT:
    input_00 = (this->value_).utinyint;
    bVar7 = TryCast::Operation<unsigned_char,duckdb::uhugeint_t>
                      (input_00,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_char,duckdb::uhugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)input_00,input_05);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case USMALLINT:
    input_01 = (this->value_).usmallint;
    bVar7 = TryCast::Operation<unsigned_short,duckdb::uhugeint_t>
                      (input_01,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      Var21 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_short,duckdb::uhugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)input_01,
                 (unsigned_short)((unkuint10)Var21 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var21,(string *)&local_98);
      __cxa_throw((InvalidInputException *)Var21,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case UINTEGER:
    uVar3 = (this->value_).uinteger;
    bVar7 = TryCast::Operation<unsigned_int,duckdb::uhugeint_t>(uVar3,(uhugeint_t *)&local_b0,false)
    ;
    if (!bVar7) {
      auVar18 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_int,duckdb::uhugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)uVar3,auVar18._8_4_);
      InvalidInputException::InvalidInputException(auVar18._0_8_,(string *)&local_98);
      __cxa_throw(auVar18._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case UBIGINT:
    pdVar17 = (duckdb *)(this->value_).ubigint;
    bVar7 = TryCast::Operation<unsigned_long,duckdb::uhugeint_t>
                      ((uint64_t)pdVar17,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      auVar20 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_long,duckdb::uhugeint_t>((string *)&local_98,pdVar17,auVar20._8_8_)
      ;
      InvalidInputException::InvalidInputException(auVar20._0_8_,(string *)&local_98);
      __cxa_throw(auVar20._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case TIMESTAMP_TZ:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME_TZ:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INVALID,UINT128);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UHUGEINT:
    pdVar17 = (duckdb *)(this->value_).hugeint.lower;
    uVar4 = (this->value_).hugeint.upper;
    uVar15 = 0;
    bVar7 = TryCast::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t>
                      ((this->value_).uhugeint,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      uVar19.upper = uVar15;
      uVar19.lower = uVar4;
      CastExceptionText<duckdb::uhugeint_t,duckdb::uhugeint_t>((string *)&local_98,pdVar17,uVar19);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case HUGEINT:
  case UUID:
    pdVar17 = (duckdb *)(this->value_).hugeint.lower;
    uVar4 = (this->value_).hugeint.upper;
    iVar14 = 0;
    bVar7 = TryCast::Operation<duckdb::hugeint_t,duckdb::uhugeint_t>
                      ((this->value_).hugeint,(uhugeint_t *)&local_b0,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_06.upper = iVar14;
      input_06.lower = uVar4;
      CastExceptionText<duckdb::hugeint_t,duckdb::uhugeint_t>((string *)&local_98,pdVar17,input_06);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) {
        uVar19 = Cast::Operation<unsigned_int,duckdb::uhugeint_t>((this->value_).uinteger);
        return uVar19;
      }
      if (PVar2 != UINT16) {
        if (PVar2 == UINT8) {
          uVar19 = Cast::Operation<unsigned_char,duckdb::uhugeint_t>((this->value_).utinyint);
          return uVar19;
        }
        pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
        local_98.type_._0_8_ =
             &local_98.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid Internal Type for ENUMs","");
        InternalException::InternalException(pIVar13,(string *)&local_98);
        __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar19 = Cast::Operation<unsigned_short,duckdb::uhugeint_t>((this->value_).usmallint);
      return uVar19;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Unimplemented type \"%s\" for GetValue()","");
    LogicalType::ToString_abi_cxx11_(&local_40,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (pNVar12,(string *)&local_98,&local_40);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar5.upper = (uint64_t)
                local_b0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar5.lower._0_1_ = local_b0.id_;
  uVar5.lower._1_1_ = local_b0.physical_type_;
  uVar5.lower._2_6_ = local_b0._2_6_;
  return uVar5;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}